

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O3

Handle * __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Insert
          (ShardedLRUCache *this,Slice *key,void *value,size_t charge,
          _func_void_Slice_ptr_void_ptr *deleter)

{
  size_t *psVar1;
  long lVar2;
  size_t sVar3;
  bool bVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  LRUHandle *pLVar9;
  LRUHandle **ppLVar10;
  LRUHandle *pLVar11;
  undefined8 uVar12;
  long lVar13;
  Mutex *__mutex;
  LRUCache *this_00;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = Hash(key->data_,key->size_,0);
  uVar6 = uVar5 >> 0x1c;
  __mutex = &this->shard_[uVar6].mutex_;
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar7 == 0) {
    this_00 = this->shard_ + uVar6;
    sVar3 = key->size_;
    pLVar9 = (LRUHandle *)malloc(sVar3 + 0x47);
    pLVar9->value = value;
    pLVar9->deleter = deleter;
    pLVar9->charge = charge;
    pLVar9->key_length = sVar3;
    pLVar9->hash = uVar5;
    pLVar9->in_cache = false;
    pLVar9->refs = 1;
    lVar13 = 0;
    if (0x43 < sVar3 + 0x47) {
      lVar13 = sVar3 + 3;
    }
    __memcpy_chk(pLVar9->key_data,key->data_,sVar3,lVar13);
    if (this_00->capacity_ == 0) {
      pLVar9->next = (LRUHandle *)0x0;
    }
    else {
      pLVar9->refs = 2;
      pLVar9->in_cache = true;
      pLVar9->next = &this->shard_[uVar6].in_use_;
      pLVar11 = this->shard_[uVar6].in_use_.prev;
      pLVar9->prev = pLVar11;
      pLVar11->next = pLVar9;
      pLVar11 = pLVar9->next;
      pLVar11->prev = pLVar9;
      psVar1 = &this->shard_[uVar6].usage_;
      *psVar1 = *psVar1 + charge;
      if (pLVar11 == pLVar9) {
LAB_00675f6d:
        __assert_fail("next != this",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/util/cache.cc"
                      ,0x3a,"Slice leveldb::(anonymous namespace)::LRUHandle::key() const");
      }
      ppLVar10 = HandleTable::FindPointer
                           ((HandleTable *)(ulong)this->shard_[uVar6].table_.length_,
                            (Slice *)this->shard_[uVar6].table_.list_,(uint32_t)pLVar9->key_data);
      pLVar11 = *ppLVar10;
      if (pLVar11 == (LRUHandle *)0x0) {
        pLVar9->next_hash = (LRUHandle *)0x0;
        *ppLVar10 = pLVar9;
        uVar8 = this->shard_[uVar6].table_.elems_ + 1;
        this->shard_[uVar6].table_.elems_ = uVar8;
        if (this->shard_[uVar6].table_.length_ < uVar8) {
          HandleTable::Resize(&this->shard_[uVar6].table_);
        }
      }
      else {
        pLVar9->next_hash = pLVar11->next_hash;
        *ppLVar10 = pLVar9;
      }
      LRUCache::FinishErase(this_00,pLVar11);
    }
    while ((this_00->capacity_ < this->shard_[uVar6].usage_ &&
           (pLVar11 = this->shard_[uVar6].lru_.next, pLVar11 != &this->shard_[uVar6].lru_))) {
      if (pLVar11->refs != 1) {
        __assert_fail("old->refs == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/util/cache.cc"
                      ,0x127,
                      "Cache::Handle *leveldb::(anonymous namespace)::LRUCache::Insert(const Slice &, uint32_t, void *, size_t, void (*)(const Slice &, void *))"
                     );
      }
      if (pLVar11->next == pLVar11) goto LAB_00675f6d;
      pLVar11 = HandleTable::Remove(&this->shard_[uVar6].table_,(Slice *)pLVar11->key_data,
                                    (uint32_t)pLVar11->key_length);
      bVar4 = LRUCache::FinishErase(this_00,pLVar11);
      if (!bVar4) {
        __assert_fail("erased",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/util/cache.cc"
                      ,0x12a,
                      "Cache::Handle *leveldb::(anonymous namespace)::LRUCache::Insert(const Slice &, uint32_t, void *, size_t, void (*)(const Slice &, void *))"
                     );
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return (Handle *)pLVar9;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    uVar12 = std::__throw_system_error(iVar7);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar12);
    }
  }
  __stack_chk_fail();
}

Assistant:

Handle* Insert(const Slice& key, void* value, size_t charge,
                 void (*deleter)(const Slice& key, void* value)) override {
    const uint32_t hash = HashSlice(key);
    return shard_[Shard(hash)].Insert(key, hash, value, charge, deleter);
  }